

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O0

int defer(thread_pool *pool,runnable_t runnable)

{
  int iVar1;
  undefined8 *data;
  runnable_t *new_runnable;
  thread_pool *pool_local;
  
  if (pool == (thread_pool *)0x0) {
    pool_local._4_4_ = -3;
  }
  else {
    iVar1 = sem_wait((sem_t *)&pool->pool_mutex);
    if (iVar1 == 0) {
      if ((pool->end & 1U) == 1) {
        iVar1 = sem_post((sem_t *)&pool->pool_mutex);
        if (iVar1 == 0) {
          pool_local._4_4_ = -6;
        }
        else {
          pool_local._4_4_ = -4;
        }
      }
      else {
        data = (undefined8 *)malloc(0x18);
        if (data == (undefined8 *)0x0) {
          pool_local._4_4_ = -2;
        }
        else {
          *data = runnable.function;
          data[1] = runnable.arg;
          data[2] = runnable.argsz;
          iVar1 = enqueue(pool->runnables,data);
          if ((iVar1 == 0) && (iVar1 = sem_post((sem_t *)&pool->runnables_semaphore), iVar1 == 0)) {
            iVar1 = sem_post((sem_t *)&pool->pool_mutex);
            if (iVar1 != 0) {
              free(data);
              return -4;
            }
            return 0;
          }
          free(data);
          pool_local._4_4_ = -5;
        }
      }
    }
    else {
      pool_local._4_4_ = -4;
    }
  }
  return pool_local._4_4_;
}

Assistant:

int defer(struct thread_pool *pool, runnable_t runnable) {
    /* Checks if the pointer is valid. */
    if(pool == NULL) {
        return invalid_argument_error;
    }

    /* Gets permission to edit pool. */
    if(sem_wait(&(pool->pool_mutex))){
        return semaphore_error;
    }

    /* Checks, if is allowed do add new task to the pool. */
    if(pool->end == true){
        if(sem_post(&(pool->pool_mutex))) {
            return semaphore_error;
        }
        return user_error;
    }

    /* Adds the task. */
    runnable_t* new_runnable;
    if(!(new_runnable = malloc(sizeof(runnable)))) {
        return memory_error;
    }

    new_runnable->function = runnable.function;
    new_runnable->arg = runnable.arg;
    new_runnable->argsz = runnable.argsz;

    if(enqueue(pool->runnables, new_runnable) || (sem_post(&(pool->runnables_semaphore)))) {
        free(new_runnable);
        return queue_error;
    }

    if(sem_post(&(pool->pool_mutex))) {
        free(new_runnable);
        return semaphore_error;
    }

    return success;
}